

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ShaderSourceSplitCase::buildProgram
          (ShaderSourceSplitCase *this,Shader *shader)

{
  TestLog *log;
  RenderContext *renderCtx;
  Shader *vertShader;
  char *__to;
  Shader *fragShader;
  char *__from;
  bool bVar1;
  char *supportShaderSource;
  Program program;
  Shader supportShader;
  char *local_d8;
  Program local_d0;
  Shader local_90;
  
  log = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  renderCtx = ((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx;
  bVar1 = this->m_shaderType != SHADERTYPE_FRAGMENT;
  local_d8 = "#version 300 es\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n";
  if (bVar1) {
    local_d8 = 
    "#version 300 es\nlayout(location = 0) out mediump vec4 o_fragColor;\nvoid main (void)\n{\n\to_fragColor = vec4(0.0);\n}\n"
    ;
  }
  glu::Shader::Shader(&local_90,renderCtx,(uint)bVar1);
  glu::Program::Program(&local_d0,renderCtx);
  glu::Shader::setSources(&local_90,1,&local_d8,(int *)0x0);
  glu::Shader::compile(&local_90);
  glu::Program::attachShader(&local_d0,shader->m_shader);
  __from = (char *)(ulong)local_90.m_shader;
  glu::Program::attachShader(&local_d0,local_90.m_shader);
  glu::Program::link(&local_d0,__from,__to);
  fragShader = shader;
  vertShader = &local_90;
  if (this->m_shaderType == SHADERTYPE_VERTEX) {
    fragShader = &local_90;
    vertShader = shader;
  }
  anon_unknown_0::logVertexFragmentProgram(log,renderCtx,&local_d0,vertShader,fragShader);
  glu::Program::~Program(&local_d0);
  glu::Shader::~Shader(&local_90);
  return;
}

Assistant:

void buildProgram (glu::Shader& shader)
	{
		TestLog&				log					= m_testCtx.getLog();
		glu::RenderContext&		renderCtx			= m_context.getRenderContext();

		const glu::ShaderType	supportShaderType	= (m_shaderType == glu::SHADERTYPE_FRAGMENT ? glu::SHADERTYPE_VERTEX : glu::SHADERTYPE_FRAGMENT);
		const char*				supportShaderSource	= getSimpleShaderSource(supportShaderType);
		glu::Shader				supportShader		(renderCtx, supportShaderType);

		glu::Program			program				(renderCtx);

		supportShader.setSources(1, &supportShaderSource, 0);
		supportShader.compile();

		program.attachShader(shader.getShader());
		program.attachShader(supportShader.getShader());

		program.link();

		if (m_shaderType == glu::SHADERTYPE_VERTEX)
			logVertexFragmentProgram(log, renderCtx, program, shader, supportShader);
		else
			logVertexFragmentProgram(log, renderCtx, program, supportShader, shader);
	}